

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_traits.c
# Opt level: O2

int mpt_type_add(mpt_type_traits *traits)

{
  byte bVar1;
  generic_traits_chunk *pgVar2;
  int iVar3;
  int iVar4;
  generic_traits_chunk *pgVar5;
  
  iVar3 = -1;
  if ((traits != (mpt_type_traits *)0x0) && (traits->size != 0)) {
    pgVar2 = generic_types;
    if (generic_types == (generic_traits_chunk *)0x0) {
      pgVar2 = (generic_traits_chunk *)malloc(0x100);
      if (pgVar2 == (generic_traits_chunk *)0x0) {
        return -4;
      }
      pgVar2->next = (generic_traits_chunk *)0x0;
      pgVar2->used = '\0';
      generic_types = pgVar2;
      atexit(_generic_types_fini);
    }
    iVar4 = 0x900;
    while( true ) {
      pgVar5 = pgVar2;
      bVar1 = pgVar5->used;
      if (bVar1 != 0x1e) break;
      iVar4 = iVar4 + 0x1e;
      pgVar2 = pgVar5->next;
      if (pgVar5->next == (generic_traits_chunk *)0x0) {
        if (0xfff < iVar4) {
          return -3;
        }
        pgVar2 = (generic_traits_chunk *)malloc(0x100);
        if (pgVar2 == (generic_traits_chunk *)0x0) {
          return -4;
        }
        pgVar2->next = (generic_traits_chunk *)0x0;
        pgVar2->used = '\0';
        pgVar5->next = pgVar2;
      }
    }
    iVar4 = iVar4 + (uint)bVar1;
    iVar3 = -3;
    if (iVar4 < 0x1000) {
      pgVar5->used = bVar1 + 1;
      pgVar5->traits[bVar1] = traits;
      iVar3 = iVar4;
    }
  }
  return iVar3;
}

Assistant:

extern int mpt_type_add(const MPT_STRUCT(type_traits) *traits)
{
	struct generic_traits_chunk *curr;
	int pos = MPT_ENUM(_TypeValueAdd);
	
	/* must have valid size */
	if (!traits || !traits->size) {
		return MPT_ERROR(BadArgument);
	}
	/* create initial traits chunk */
	if (!(curr = generic_types)) {
		if (!(curr = malloc(sizeof(*generic_types)))) {
			return MPT_ERROR(BadOperation);
		}
		curr->next = 0;
		curr->used = 0;
		generic_types = curr;
		atexit(_generic_types_fini);
	}
	/* find available traits chunk entry */
	while (curr->used == MPT_arrsize(curr->traits)) {
		struct generic_traits_chunk *next;
		pos += MPT_arrsize(curr->traits);
		/* append new empty chunk */
		if (!(next = curr->next)) {
			if (pos > MPT_ENUM(_TypeValueMax)) {
				return MPT_ERROR(BadType);
			}
			if (!(next = malloc(sizeof(*next)))) {
				return MPT_ERROR(BadOperation);
			}
			next->next = 0;
			next->used = 0;
			curr->next = next;
		}
		curr = next;
	}
	pos += curr->used;
	if (pos > MPT_ENUM(_TypeValueMax)) {
		return MPT_ERROR(BadType);
	}
	curr->traits[curr->used++] = traits;
	return pos;
}